

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_script.cpp
# Opt level: O0

UniValue *
DeriveAddresses(Descriptor *desc,int64_t range_begin,int64_t range_end,
               FlatSigningProvider *key_provider)

{
  byte bVar1;
  bool bVar2;
  undefined1 uVar3;
  string *message;
  iterator scriptPubKey;
  size_type sVar4;
  add_pointer_t<PubKeyDestination> ptVar5;
  undefined8 uVar6;
  long in_RCX;
  ulong in_RDX;
  long *in_RSI;
  UniValue *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  CScript *script;
  vector<CScript,_std::allocator<CScript>_> *__range2;
  int64_t i;
  UniValue *addresses;
  iterator __end2;
  iterator __begin2;
  vector<CScript,_std::allocator<CScript>_> scripts;
  CTxDestination dest;
  FlatSigningProvider provider;
  FlatSigningProvider *in_stack_fffffffffffffc98;
  vector<CScript,_std::allocator<CScript>_> *in_stack_fffffffffffffca0;
  UniValue *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  VType in_stack_fffffffffffffcb4;
  UniValue *in_stack_fffffffffffffcb8;
  undefined7 in_stack_fffffffffffffcd0;
  UniValue *in_stack_fffffffffffffcd8;
  char *in_stack_fffffffffffffce0;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  ulong local_2c8;
  CTxDestination *in_stack_fffffffffffffd80;
  char local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260 [10];
  undefined1 local_120 [280];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  UniValue::UniValue(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4,
                     (string *)in_stack_fffffffffffffca8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc98);
  local_2c8 = in_RDX;
  do {
    if (in_RCX < (long)local_2c8) {
      bVar2 = UniValue::empty((UniValue *)in_stack_fffffffffffffc98);
      if (bVar2) {
        uVar6 = __cxa_allocate_exception(0x58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                   (allocator<char> *)in_stack_fffffffffffffcd8);
        JSONRPCError((int)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                     (string *)in_stack_fffffffffffffcd8);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(uVar6,&UniValue::typeinfo,UniValue::~UniValue);
        }
      }
      else if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return in_RDI;
      }
LAB_0068ec89:
      __stack_chk_fail();
    }
    FlatSigningProvider::FlatSigningProvider(in_stack_fffffffffffffc98);
    in_stack_fffffffffffffce8 = local_260;
    std::vector<CScript,_std::allocator<CScript>_>::vector
              ((vector<CScript,_std::allocator<CScript>_> *)in_stack_fffffffffffffc98);
    bVar1 = (**(code **)(*in_RSI + 0x40))
                      (in_RSI,local_2c8 & 0xffffffff,in_R8,in_stack_fffffffffffffce8,local_120,0);
    if ((bVar1 & 1) == 0) {
      message = (string *)__cxa_allocate_exception(0x58);
      __s = &local_261;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffce8,__s,(allocator<char> *)message);
      JSONRPCError((int)((ulong)in_stack_fffffffffffffce8 >> 0x20),message);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(message,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_0068ec89;
    }
    std::vector<CScript,_std::allocator<CScript>_>::begin(in_stack_fffffffffffffca0);
    scriptPubKey = std::vector<CScript,_std::allocator<CScript>_>::end(in_stack_fffffffffffffca0);
    while (bVar2 = __gnu_cxx::operator==<CScript_*,_std::vector<CScript,_std::allocator<CScript>_>_>
                             ((__normal_iterator<CScript_*,_std::vector<CScript,_std::allocator<CScript>_>_>
                               *)in_stack_fffffffffffffca8,
                              (__normal_iterator<CScript_*,_std::vector<CScript,_std::allocator<CScript>_>_>
                               *)in_stack_fffffffffffffca0), ((bVar2 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::__normal_iterator<CScript_*,_std::vector<CScript,_std::allocator<CScript>_>_>::
      operator*((__normal_iterator<CScript_*,_std::vector<CScript,_std::allocator<CScript>_>_> *)
                in_stack_fffffffffffffc98);
      std::
      variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 *)in_stack_fffffffffffffc98);
      uVar3 = ExtractDestination(scriptPubKey._M_current,in_stack_fffffffffffffd80);
      if ((bool)uVar3) {
        EncodeDestination_abi_cxx11_((CTxDestination *)in_stack_fffffffffffffca8);
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (in_stack_fffffffffffffcd8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar3,in_stack_fffffffffffffcd0));
        UniValue::push_back((UniValue *)
                            CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                            in_stack_fffffffffffffca8);
        UniValue::~UniValue((UniValue *)in_stack_fffffffffffffc98);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc98);
      }
      else {
        sVar4 = std::vector<CScript,_std::allocator<CScript>_>::size
                          ((vector<CScript,_std::allocator<CScript>_> *)in_stack_fffffffffffffc98);
        if ((sVar4 < 2) ||
           (ptVar5 = std::
                     get_if<PubKeyDestination,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                               ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                 *)in_stack_fffffffffffffc98),
           ptVar5 == (add_pointer_t<PubKeyDestination>)0x0)) {
          uVar6 = __cxa_allocate_exception(0x58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                     (allocator<char> *)in_stack_fffffffffffffcd8);
          JSONRPCError((int)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                       (string *)in_stack_fffffffffffffcd8);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(uVar6,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_0068ec89;
        }
      }
      std::
      variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  *)in_stack_fffffffffffffc98);
      __gnu_cxx::__normal_iterator<CScript_*,_std::vector<CScript,_std::allocator<CScript>_>_>::
      operator++((__normal_iterator<CScript_*,_std::vector<CScript,_std::allocator<CScript>_>_> *)
                 in_stack_fffffffffffffc98);
    }
    std::vector<CScript,_std::allocator<CScript>_>::~vector
              ((vector<CScript,_std::allocator<CScript>_> *)in_stack_fffffffffffffca8);
    FlatSigningProvider::~FlatSigningProvider(in_stack_fffffffffffffc98);
    local_2c8 = local_2c8 + 1;
  } while( true );
}

Assistant:

static UniValue DeriveAddresses(const Descriptor* desc, int64_t range_begin, int64_t range_end, FlatSigningProvider& key_provider)
{
    UniValue addresses(UniValue::VARR);

    for (int64_t i = range_begin; i <= range_end; ++i) {
        FlatSigningProvider provider;
        std::vector<CScript> scripts;
        if (!desc->Expand(i, key_provider, scripts, provider)) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Cannot derive script without private keys");
        }

        for (const CScript& script : scripts) {
            CTxDestination dest;
            if (!ExtractDestination(script, dest)) {
                // ExtractDestination no longer returns true for P2PK since it doesn't have a corresponding address
                // However combo will output P2PK and should just ignore that script
                if (scripts.size() > 1 && std::get_if<PubKeyDestination>(&dest)) {
                    continue;
                }
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Descriptor does not have a corresponding address");
            }

            addresses.push_back(EncodeDestination(dest));
        }
    }

    // This should not be possible, but an assert seems overkill:
    if (addresses.empty()) {
        throw JSONRPCError(RPC_MISC_ERROR, "Unexpected empty result");
    }

    return addresses;
}